

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::(anonymous_namespace)::test<vk::Handle<(vk::HandleType)7>>
          (TestStatus *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context)

{
  VkAllocationCallbacks *allocator;
  AllocationCallbackRecorder recordingAllocator;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&recordingAllocator,allocator,1);
  api::anon_unknown_1::release((Context *)this,(VkDeviceMemory)0x0,(VkAllocationCallbacks *)0x0);
  api::anon_unknown_1::release
            ((Context *)this,(VkDeviceMemory)0x0,
             &recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  api::anon_unknown_1::reportStatus
            (__return_storage_ptr__,recordingAllocator.m_records.m_numElements == 0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recordingAllocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	const Object					nullHandle			= DE_NULL;
	const VkAllocationCallbacks*	pNullAllocator		= DE_NULL;
	AllocationCallbackRecorder		recordingAllocator	(getSystemAllocator(), 1u);

	// Implementation should silently ignore a delete/free of a NULL handle.

	release(context, nullHandle, pNullAllocator);
	release(context, nullHandle, recordingAllocator.getCallbacks());

	return reportStatus(recordingAllocator.getNumRecords() == 0);
}